

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

Arguments * __thiscall
Corrade::Utility::Arguments::addSkippedPrefix(Arguments *this,string *prefix,string *help)

{
  bool bVar1;
  ostream *poVar2;
  Debug *pDVar3;
  Entry *pEVar4;
  long lVar5;
  Error local_50;
  
  bVar1 = skippedPrefix(this,prefix);
  if (bVar1) {
    poVar2 = Error::defaultOutput();
    Error::Error(&local_50,poVar2,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_50.super_Debug,
                               "Utility::Arguments::addSkippedPrefix(): prefix");
    pDVar3 = Implementation::debugPrintStlString(pDVar3,prefix);
    Debug::operator<<(pDVar3,"already added");
  }
  else {
    pEVar4 = (this->_entries)._data;
    lVar5 = (this->_entries)._size * 0xb0;
    do {
      if (lVar5 == 0) {
        std::__cxx11::string::push_back((char)prefix);
        Containers::
        arrayAppend<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string,std::__cxx11::string>
                  (&this->_skippedPrefixes,prefix,help);
        return this;
      }
      bVar1 = anon_unknown_3::keyHasPrefix(&pEVar4->key,prefix);
      pEVar4 = pEVar4 + 1;
      lVar5 = lVar5 + -0xb0;
    } while (!bVar1);
    poVar2 = Error::defaultOutput();
    Error::Error(&local_50,poVar2,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_50.super_Debug,
                               "Utility::Arguments::addSkippedPrefix(): skipped prefix");
    pDVar3 = Implementation::debugPrintStlString(pDVar3,prefix);
    Debug::operator<<(pDVar3,"conflicts with existing keys");
  }
  Error::~Error(&local_50);
  abort();
}

Assistant:

Arguments& Arguments::addSkippedPrefix(std::string prefix, std::string help) {
    CORRADE_ASSERT(!skippedPrefix(prefix),
        "Utility::Arguments::addSkippedPrefix(): prefix" << prefix << "already added", *this);

    /* Verify that no already added option conflicts with this */
    #ifndef CORRADE_NO_ASSERT
    for(const Entry& entry: _entries)
        CORRADE_ASSERT(!keyHasPrefix(entry.key, prefix),
            "Utility::Arguments::addSkippedPrefix(): skipped prefix" << prefix << "conflicts with existing keys", *this);
    #endif

    /* Add `-` to the end so we always compare with `--prefix-` and not just
       `--prefix` */
    prefix += '-';

    arrayAppend(_skippedPrefixes, InPlaceInit, std::move(prefix), std::move(help));
    return *this;
}